

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm_w(wchar_t *p,wchar_t *s,wchar_t flags)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t in_EDX;
  wchar_t *in_RSI;
  wchar_t *in_RDI;
  wchar_t *end;
  wchar_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 uVar5;
  wchar_t *in_stack_ffffffffffffffd8;
  wchar_t *local_18;
  wchar_t *local_10;
  wchar_t local_4;
  
  local_18 = in_RSI;
  if ((*in_RSI == L'.') && (in_RSI[1] == L'/')) {
    local_18 = pm_slashskip_w(in_RSI + 1);
  }
  local_10 = in_RDI;
  if ((*in_RDI == L'.') && (in_RDI[1] == L'/')) {
    local_10 = pm_slashskip_w(in_RDI + 1);
  }
  do {
    wVar2 = *local_10;
    if (wVar2 == L'\0') {
      if (*local_18 == L'/') {
        if ((in_EDX & 2U) != 0) {
          return L'\x01';
        }
        local_18 = pm_slashskip_w(local_18);
      }
      return (uint)(*local_18 == L'\0');
    }
    if (wVar2 == L'$') {
      if ((local_10[1] == L'\0') && ((in_EDX & 2U) != 0)) {
        pwVar3 = pm_slashskip_w(local_18);
        return (uint)(*pwVar3 == L'\0');
      }
LAB_0011f3b7:
      if (*local_10 != *local_18) {
        return L'\0';
      }
    }
    else {
      if (wVar2 == L'*') {
        for (; *local_10 == L'*'; local_10 = local_10 + 1) {
        }
        if (*local_10 == L'\0') {
          local_4 = L'\x01';
        }
        else {
          uVar5 = 0x2a;
          for (; *local_18 != L'\0'; local_18 = local_18 + 1) {
            wVar2 = __archive_pathmatch_w
                              (in_stack_ffffffffffffffd8,
                               (wchar_t *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc);
            if (wVar2 != L'\0') {
              return L'\x01';
            }
          }
          local_4 = L'\0';
        }
        return local_4;
      }
      if (wVar2 == L'/') {
        if ((*local_18 != L'/') && (*local_18 != L'\0')) {
          return L'\0';
        }
        local_10 = pm_slashskip_w(local_10);
        local_18 = pm_slashskip_w(local_18);
        if ((*local_10 == L'\0') && ((in_EDX & 2U) != 0)) {
          return L'\x01';
        }
        local_10 = local_10 + -1;
        local_18 = local_18 + -1;
      }
      else if (wVar2 == L'?') {
        if (*local_18 == L'\0') {
          return L'\0';
        }
      }
      else {
        uVar4 = in_stack_ffffffffffffffd0;
        pwVar3 = local_10;
        if (wVar2 == L'[') {
          while( true ) {
            pwVar1 = pwVar3;
            in_stack_ffffffffffffffd8 = pwVar1 + 1;
            in_stack_ffffffffffffffd0 = uVar4 & 0xffffff;
            if (*in_stack_ffffffffffffffd8 != L'\0') {
              in_stack_ffffffffffffffd0 = CONCAT13(*in_stack_ffffffffffffffd8 != L']',(int3)uVar4);
            }
            if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
            uVar4 = in_stack_ffffffffffffffd0;
            pwVar3 = in_stack_ffffffffffffffd8;
            if ((*in_stack_ffffffffffffffd8 == L'\\') &&
               (pwVar3 = in_stack_ffffffffffffffd8, pwVar1[2] != L'\0')) {
              pwVar3 = pwVar1 + 2;
            }
          }
          if (*in_stack_ffffffffffffffd8 == L']') {
            wVar2 = pm_list_w(local_10 + 1,in_stack_ffffffffffffffd8,*local_18,in_EDX);
            local_10 = in_stack_ffffffffffffffd8;
            if (wVar2 == L'\0') {
              return L'\0';
            }
          }
          else if (*local_10 != *local_18) {
            return L'\0';
          }
        }
        else {
          if (wVar2 != L'\\') goto LAB_0011f3b7;
          if (local_10[1] == L'\0') {
            if (*local_18 != L'\\') {
              return L'\0';
            }
          }
          else {
            local_10 = local_10 + 1;
            if (*local_10 != *local_18) {
              return L'\0';
            }
          }
        }
      }
    }
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static int
pm_w(const wchar_t *p, const wchar_t *s, int flags)
{
	const wchar_t *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == L'.' && s[1] == L'/')
		s = pm_slashskip_w(s + 1);
	if (p[0] == L'.' && p[1] == L'/')
		p = pm_slashskip_w(p + 1);

	for (;;) {
		switch (*p) {
		case L'\0':
			if (s[0] == L'/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip_w(s);
			}
			return (*s == L'\0');
		case L'?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == L'\0')
				return (0);
			break;
		case L'*':
			/* "*" == "**" == "***" ... */
			while (*p == L'*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == L'\0')
				return (1);
			while (*s) {
				if (archive_pathmatch_w(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case L'[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != L'\0' && *end != L']') {
				if (*end == L'\\' && end[1] != L'\0')
					++end;
				++end;
			}
			if (*end == L']') {
				/* We found [...], try to match it. */
				if (!pm_list_w(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case L'\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == L'\0') {
				if (*s != L'\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case L'/':
			if (*s != L'/' && *s != L'\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip_w(p);
			s = pm_slashskip_w(s);
			if (*p == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case L'$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip_w(s) == L'\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}